

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

char * fio_sha1_result(fio_sha1_s *s)

{
  uint uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  uint64_t *len;
  size_t in_buffer;
  fio_sha1_s *s_local;
  
  uVar2 = s->length & 0x3f;
  if (uVar2 < 0x38) {
    if (uVar2 == 0x37) {
      s->buffer[0x37] = 0x80;
    }
    else {
      memcpy(s->buffer + uVar2,sha1_padding,0x38 - uVar2);
    }
  }
  else {
    memcpy(s->buffer + uVar2,sha1_padding,0x40 - uVar2);
    fio_sha1_perform_all_rounds(s,s->buffer);
    memcpy(s->buffer,sha1_padding + 1,0x38);
  }
  puVar3 = s->buffer + 0x38;
  *(uint64_t *)puVar3 = s->length << 3;
  uVar2 = *(ulong *)puVar3;
  *(ulong *)puVar3 =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  fio_sha1_perform_all_rounds(s,s->buffer);
  uVar1 = (s->digest).i[0];
  (s->digest).i[0] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
  ;
  uVar1 = (s->digest).i[1];
  (s->digest).i[1] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
  ;
  uVar1 = (s->digest).i[2];
  (s->digest).i[2] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
  ;
  uVar1 = (s->digest).i[3];
  (s->digest).i[3] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
  ;
  uVar1 = (s->digest).i[4];
  (s->digest).i[4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
  ;
  return (char *)&s->digest;
}

Assistant:

char *fio_sha1_result(fio_sha1_s *s) {
  size_t in_buffer = s->length & 63;
  if (in_buffer > 55) {
    memcpy(s->buffer + in_buffer, sha1_padding, 64 - in_buffer);
    fio_sha1_perform_all_rounds(s, s->buffer);
    memcpy(s->buffer, sha1_padding + 1, 56);
  } else if (in_buffer != 55) {
    memcpy(s->buffer + in_buffer, sha1_padding, 56 - in_buffer);
  } else {
    s->buffer[55] = sha1_padding[0];
  }
  /* store the length in BITS - alignment should be promised by struct */
  /* this must the number in BITS, encoded as a BIG ENDIAN 64 bit number */
  uint64_t *len = (uint64_t *)(s->buffer + 56);
  *len = s->length << 3;
  *len = fio_lton64(*len);
  fio_sha1_perform_all_rounds(s, s->buffer);

  /* change back to little endian */
  s->digest.i[0] = fio_ntol32(s->digest.i[0]);
  s->digest.i[1] = fio_ntol32(s->digest.i[1]);
  s->digest.i[2] = fio_ntol32(s->digest.i[2]);
  s->digest.i[3] = fio_ntol32(s->digest.i[3]);
  s->digest.i[4] = fio_ntol32(s->digest.i[4]);

  return (char *)s->digest.str;
}